

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  SourceLocation location;
  Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
  *other;
  Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  *pPVar1;
  undefined4 in_register_00000034;
  _func_int **pp_Var2;
  undefined8 in_stack_ffffffffffffff70;
  TwoPartyVatNetwork *this_00;
  SourceLocation local_68;
  undefined1 local_50 [8];
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  paf;
  undefined1 local_28 [24];
  TwoPartyVatNetwork *this_local;
  
  pp_Var2 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  local_28._16_8_ = pp_Var2;
  this_local = this;
  if ((*(short *)((long)pp_Var2 + 0x34) == 0) && (((ulong)pp_Var2[0x27] & 1) == 0)) {
    *(undefined1 *)(pp_Var2 + 0x27) = 1;
    this_00 = (TwoPartyVatNetwork *)local_28;
    asConnection(this_00);
    kj::
    Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ::Promise((Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
               *)this,(FixVoid<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection>_>
                       *)this_00);
    kj::
    Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
    ::~Own((Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
            *)local_28);
  }
  else {
    kj::SourceLocation::SourceLocation
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty.c++"
               ,"accept",0x7a,0x10);
    location.function = (char *)local_68._16_8_;
    location.fileName = local_68.function;
    location.lineNumber = (int)in_stack_ffffffffffffff70;
    location.columnNumber = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
    kj::
    newPromiseAndFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>
              (location);
    other = kj::
            mv<kj::Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>,decltype(nullptr)>>
                      ((Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
                        *)&paf);
    kj::
    Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
    ::operator=((Own<kj::PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>,_std::nullptr_t>
                 *)(pp_Var2 + 0x5e),other);
    pPVar1 = kj::
             mv<kj::Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>>
                       ((Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
                         *)local_50);
    kj::
    Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ::Promise((Promise<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
               *)this,pPVar1);
    kj::
    PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ::~PromiseFulfillerPair
              ((PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
                *)local_50);
  }
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}